

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

btVector3 __thiscall btSoftBody::evaluateCom(btSoftBody *this)

{
  float fVar1;
  long lVar2;
  btScalar *pbVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uVar6;
  btVector3 bVar7;
  
  uVar5 = 0;
  if ((this->m_pose).m_bframe == true) {
    lVar2 = (long)(this->m_nodes).m_size;
    uVar6 = 0;
    if (0 < lVar2) {
      pbVar3 = (((this->m_nodes).m_data)->m_x).m_floats + 2;
      lVar4 = 0;
      do {
        fVar1 = (this->m_pose).m_wgh.m_data[lVar4];
        uVar6 = (ulong)(uint)((float)uVar6 + *pbVar3 * fVar1);
        uVar5 = CONCAT44((float)((ulong)uVar5 >> 0x20) +
                         fVar1 * (float)((ulong)*(undefined8 *)
                                                 ((btVector3 *)(pbVar3 + -2))->m_floats >> 0x20),
                         (float)uVar5 +
                         fVar1 * (float)*(undefined8 *)((btVector3 *)(pbVar3 + -2))->m_floats);
        lVar4 = lVar4 + 1;
        pbVar3 = pbVar3 + 0x1e;
      } while (lVar2 != lVar4);
    }
    bVar7.m_floats[2] = (btScalar)(int)uVar6;
    bVar7.m_floats[3] = (btScalar)(int)(uVar6 >> 0x20);
    bVar7.m_floats[0] = (btScalar)(int)uVar5;
    bVar7.m_floats[1] = (btScalar)(int)((ulong)uVar5 >> 0x20);
    return (btVector3)bVar7.m_floats;
  }
  return (btScalar  [4])ZEXT816(0);
}

Assistant:

btVector3		btSoftBody::evaluateCom() const
{
	btVector3	com(0,0,0);
	if(m_pose.m_bframe)
	{
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			com+=m_nodes[i].m_x*m_pose.m_wgh[i];
		}
	}
	return(com);
}